

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
::phmap_dump<phmap::BinaryOutputArchive>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           *this,BinaryOutputArchive *ar)

{
  BinaryOutputArchive::saveBinary(ar,&s_version,8);
  BinaryOutputArchive::saveBinary(ar,&this->size_,8);
  BinaryOutputArchive::saveBinary(ar,&this->capacity_,8);
  if (this->size_ != 0) {
    BinaryOutputArchive::saveBinary(ar,this->ctrl_,this->capacity_ + 0x11);
    BinaryOutputArchive::saveBinary(ar,this->slots_,this->capacity_ << 2);
    BinaryOutputArchive::saveBinary(ar,&this->settings_,8);
  }
  return true;
}

Assistant:

bool raw_hash_set<Policy, Hash, Eq, Alloc>::phmap_dump(OutputArchive& ar) const {
    static_assert(type_traits_internal::IsTriviallyCopyable<value_type>::value,
                    "value_type should be trivially copyable");

    ar.saveBinary(&s_version, sizeof(size_t));
    ar.saveBinary(&size_, sizeof(size_t));
    ar.saveBinary(&capacity_, sizeof(size_t));
    if (size_ == 0)
        return true;
    ar.saveBinary(ctrl_,  sizeof(ctrl_t) * (capacity_ + Group::kWidth + 1));
    ar.saveBinary(slots_, sizeof(slot_type) * capacity_);
    ar.saveBinary(&growth_left(), sizeof(size_t));
    return true;
}